

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.c
# Opt level: O0

void gc_pose_log(gc_pose *x)

{
  int local_14;
  int i;
  gc_pose *x_local;
  
  if (x == (gc_pose *)0x0) {
    __assert_fail("x",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x3a,"void gc_pose_log(const struct gc_pose *)");
  }
  if ((x->rotation != (matrix3x3 *)0x0) && (x->translation != (vector3 *)0x0)) {
    printf("PoseCoord(rotation=[");
    for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
      if (local_14 != 0) {
        printf("                    ");
      }
      printf("[%5.2f, %5.2f, %5.2f]",
             *(undefined8 *)((long)&x->rotation->field_0 + (long)local_14 * 0x18),
             *(undefined8 *)((long)&x->rotation->field_0 + (long)local_14 * 0x18 + 8),
             *(undefined8 *)((long)&x->rotation->field_0 + (long)local_14 * 0x18 + 0x10));
      if (local_14 != 2) {
        printf(",\n");
      }
    }
    printf("],\n       translation=[[%5.3f, %5.3f, %5.3f]])\n",(x->translation->field_0).field_0.x,
           (x->translation->field_0).field_0.y,(x->translation->field_0).field_0.z);
    return;
  }
  __assert_fail("x->rotation && x->translation",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                ,0x3b,"void gc_pose_log(const struct gc_pose *)");
}

Assistant:

void gc_pose_log(
        const struct gc_pose *x)
{
    assert(x);
    assert(x->rotation && x->translation);

    printf("PoseCoord(rotation=[");
    for (int i = 0; i < 3; i++) {
        if (i != 0) printf("                    ");
        printf("[%5.2f, %5.2f, %5.2f]",
                x->rotation->row[i].x,
                x->rotation->row[i].y,
                x->rotation->row[i].z);
        if (i != 2) printf(",\n");
    }
    printf("],\n       translation=[[%5.3f, %5.3f, %5.3f]])\n",
            x->translation->x,
            x->translation->y,
            x->translation->z);
}